

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O2

int luaV_lessthan(lua_State *L,TValue *l,TValue *r)

{
  double f;
  int iVar1;
  uint uVar2;
  
  uVar2 = l->tt_ & 0xf;
  if (uVar2 == 4) {
    if ((r->tt_ & 0xfU) == 4) {
      uVar2 = l_strcmp((TString *)(l->value_).gc,(TString *)(r->value_).gc);
      return uVar2 >> 0x1f;
    }
  }
  else if ((uVar2 == 3) && (uVar2 = r->tt_, (uVar2 & 0xf) == 3)) {
    if (l->tt_ == 0x13) {
      if (uVar2 == 0x13) {
        return (uint)((l->value_).i < (r->value_).i);
      }
      iVar1 = LTintfloat((l->value_).i,(r->value_).n);
      return iVar1;
    }
    f = (l->value_).n;
    if (uVar2 == 3) {
      return (uint)(f < (r->value_).n);
    }
    if (!NAN(f)) {
      uVar2 = LEintfloat((r->value_).i,f);
      return uVar2 ^ 1;
    }
    return 0;
  }
  iVar1 = luaT_callorderTM(L,l,r,TM_LT);
  if (-1 < iVar1) {
    return iVar1;
  }
  luaG_ordererror(L,l,r);
}

Assistant:

int luaV_lessthan(lua_State *L, const TValue *l, const TValue *r) {
    int res;
    if (ttisnumber(l) && ttisnumber(r))  /* both operands are numbers? */
        return LTnum(l, r);
    else if (ttisstring(l) && ttisstring(r))  /* both are strings? */
        return l_strcmp(tsvalue(l), tsvalue(r)) < 0;
    else if ((res = luaT_callorderTM(L, l, r, TM_LT)) < 0)  /* no metamethod? */
        luaG_ordererror(L, l, r);  /* error */
    return res;
}